

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

int32_t al_fread32le(ALLEGRO_FILE *f)

{
  int32_t iVar1;
  undefined8 in_RAX;
  size_t sVar2;
  uchar b [4];
  
  b = SUB84((ulong)in_RAX >> 0x20,0);
  sVar2 = al_fread(f,b,4);
  if (sVar2 != 4) {
    b[0] = 0xff;
    b[1] = 0xff;
    b[2] = 0xff;
    b[3] = 0xff;
  }
  iVar1._0_1_ = b[0];
  iVar1._1_1_ = b[1];
  iVar1._2_1_ = b[2];
  iVar1._3_1_ = b[3];
  return iVar1;
}

Assistant:

int32_t al_fread32le(ALLEGRO_FILE *f)
{
   unsigned char b[4];
   ASSERT(f);

   if (al_fread(f, b, 4) == 4) {
      return (((int32_t)b[3] << 24) | ((int32_t)b[2] << 16) |
              ((int32_t)b[1] << 8) | (int32_t)b[0]);
   }

   return EOF;
}